

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O3

void Abc_NtkBalanceLevel(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      if (pVVar2->pArray[lVar3] != (void *)0x0) {
        puVar1 = (uint *)((long)pVVar2->pArray[lVar3] + 0x14);
        *puVar1 = *puVar1 & 0xfff;
        pVVar2 = pNtk->vObjs;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar2->nSize);
  }
  pVVar2 = pNtk->vCos;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      Abc_NtkBalanceLevel_rec
                (*(Abc_Obj_t **)
                  (*(long *)(*(long *)(*pVVar2->pArray[lVar3] + 0x20) + 8) +
                  (long)**(int **)((long)pVVar2->pArray[lVar3] + 0x20) * 8));
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vCos;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Abc_NtkBalanceLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->Level = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_NtkBalanceLevel_rec( Abc_ObjFanin0(pNode) );
}